

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void write_to_error_stream(char *msg,size_t msg_size)

{
  _Bool _Var1;
  FILE *__s;
  
  __s = (FILE *)stumpless_get_error_stream();
  if (__s == (FILE *)0x0) {
    return;
  }
  do {
    _Var1 = stdatomic_compare_exchange_bool(&error_stream_free,true,false);
  } while (!_Var1);
  fwrite(msg,1,msg_size,__s);
  stdatomic_write_bool(&error_stream_free,true);
  return;
}

Assistant:

void
write_to_error_stream( const char *msg, size_t msg_size ) {
  FILE *stream;
  bool locked;

  stream = stumpless_get_error_stream(  );
  if( !stream ) {
    return;
  }

  do{
    locked = config_compare_exchange_bool( &error_stream_free, true, false );
  } while( !locked );

  fwrite( msg, sizeof( *msg ), msg_size, stream );

  config_write_bool( &error_stream_free, true );
}